

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_3,_9>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  undefined4 in_register_00000014;
  ShaderEvalContext *evalCtx_00;
  ShaderEvalContext *extraout_RDX;
  Type in1;
  Vector<float,_3> local_80;
  tcu local_74 [12];
  Vector<float,_3> local_68;
  Mat3 local_5c;
  VecAccess<float,_4,_3> local_38;
  
  evalCtx_00 = (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type);
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_80.m_data[2] = (evalCtx->coords).m_data[2];
    local_80.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
  }
  else {
    tcu::Vector<float,_3>::Vector
              (&local_80,(Vector<float,_3> *)sr::(anonymous_namespace)::s_constInVec3);
    evalCtx_00 = extraout_RDX;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,9>
              (&local_5c,(MatrixCaseUtils *)evalCtx,evalCtx_00,in_ECX);
  }
  else {
    tcu::Matrix<float,_3,_3>::Matrix
              (&local_5c,(float *)(sr::(anonymous_namespace)::s_constInMat3x3 + 0x24));
  }
  tcu::operator*(local_74,&local_80,&local_5c);
  tcu::Vector<float,_3>::Vector(&local_68,(Vector<float,_3> *)local_74);
  local_38.m_vector = &evalCtx->color;
  local_38.m_index[0] = 0;
  local_38.m_index[1] = 1;
  local_38.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,&local_68);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}